

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

CommandLine<Catch::ConfigData> * Catch::makeCommandLineParser(void)

{
  CommandLine<Catch::ConfigData> *in_RDI;
  CommandLine<Catch::ConfigData> *cli;
  string *in_stack_ffffffffffffee48;
  ArgBinder *in_stack_ffffffffffffee50;
  ArgBinder *this;
  _func_void_ConfigData_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *in_stack_ffffffffffffee60;
  allocator *paVar1;
  CommandLine<Catch::ConfigData> *in_stack_ffffffffffffee68;
  CommandLine<Catch::ConfigData> *this_00;
  CommandLine<Catch::ConfigData> *in_stack_ffffffffffffee70;
  ArgBinder *in_stack_ffffffffffffef30;
  ArgBinder *this_01;
  undefined1 local_f29 [40];
  allocator local_f01;
  string local_f00 [183];
  undefined1 local_e49 [40];
  allocator local_e21;
  string local_e20 [39];
  allocator local_df9;
  string local_df8 [39];
  allocator local_dd1;
  string local_dd0 [183];
  allocator local_d19;
  string local_d18 [39];
  allocator local_cf1;
  string local_cf0 [39];
  allocator local_cc9;
  string local_cc8 [39];
  allocator local_ca1;
  string local_ca0 [183];
  allocator local_be9;
  string local_be8 [39];
  allocator local_bc1;
  string local_bc0 [39];
  allocator local_b99;
  string local_b98 [183];
  allocator local_ae1;
  string local_ae0 [39];
  allocator local_ab9;
  string local_ab8 [39];
  allocator local_a91;
  string local_a90 [39];
  undefined1 local_a69 [184];
  allocator local_9b1;
  string local_9b0 [39];
  allocator local_989;
  string local_988 [39];
  allocator local_961;
  string local_960 [39];
  allocator local_939;
  string local_938 [183];
  allocator local_881;
  string local_880 [39];
  allocator local_859;
  string local_858 [39];
  allocator local_831;
  string local_830 [39];
  allocator local_809;
  string local_808 [183];
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [39];
  allocator local_701;
  string local_700 [183];
  allocator local_649;
  string local_648 [39];
  allocator local_621;
  string local_620 [39];
  allocator local_5f9;
  string local_5f8 [183];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [39];
  allocator local_4f1;
  string local_4f0 [183];
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [183];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [183];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [183];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [199];
  undefined1 local_9;
  
  local_9 = 0;
  Clara::CommandLine<Catch::ConfigData>::CommandLine
            ((CommandLine<Catch::ConfigData> *)in_stack_ffffffffffffee50);
  Clara::CommandLine<Catch::ConfigData>::bindProcessName<std::__cxx11::string_Catch::ConfigData::*>
            (in_stack_ffffffffffffee70,
             (offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              )in_stack_ffffffffffffee68);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>
            (in_stack_ffffffffffffee68,(offset_in_ConfigData_to_bool)in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"display usage information",&local_d1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"?",&local_f9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"h",&local_121);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"help",&local_149);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(in_stack_ffffffffffffef30);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>
            (in_stack_ffffffffffffee68,(offset_in_ConfigData_to_bool)in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"list all (or matching) test cases",&local_201);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"l",&local_229);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"list-tests",&local_251);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(in_stack_ffffffffffffef30);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>
            (in_stack_ffffffffffffee68,(offset_in_ConfigData_to_bool)in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"list all (or matching) tags",&local_309);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"t",&local_331);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"list-tags",&local_359);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(in_stack_ffffffffffffef30);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>
            (in_stack_ffffffffffffee68,(offset_in_ConfigData_to_bool)in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"list all reporters",&local_411);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"list-reporters",&local_439);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(in_stack_ffffffffffffef30);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>
            (in_stack_ffffffffffffee68,(offset_in_ConfigData_to_bool)in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"include successful tests in output",&local_4f1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"s",&local_519);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"success",&local_541);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(in_stack_ffffffffffffef30);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>
            (in_stack_ffffffffffffee68,(offset_in_ConfigData_to_bool)in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f8,"break into debugger on failure",&local_5f9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_620,"b",&local_621);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_648,"break",&local_649);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator((allocator<char> *)&local_649);
  std::__cxx11::string::~string(local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(in_stack_ffffffffffffef30);
  Clara::CommandLine<Catch::ConfigData>::bind<bool_Catch::ConfigData::*>
            (in_stack_ffffffffffffee68,(offset_in_ConfigData_to_bool)in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_700,"skip exception tests",&local_701);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"e",&local_729);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_750,"nothrow",&local_751);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator((allocator<char> *)&local_751);
  std::__cxx11::string::~string(local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  std::__cxx11::string::~string(local_700);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(in_stack_ffffffffffffef30);
  Clara::CommandLine<Catch::ConfigData>::bind<std::__cxx11::string_Catch::ConfigData::*>
            (in_stack_ffffffffffffee68,
             (offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              )in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_808,"output filename",&local_809);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_830,"o",&local_831);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"out",&local_859);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_880,"filename",&local_881);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::argName
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_880);
  std::allocator<char>::~allocator((allocator<char> *)&local_881);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::~allocator((allocator<char> *)&local_831);
  std::__cxx11::string::~string(local_808);
  std::allocator<char>::~allocator((allocator<char> *)&local_809);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(in_stack_ffffffffffffef30);
  Clara::CommandLine<Catch::ConfigData>::bind<std::__cxx11::string_Catch::ConfigData::*>
            (in_stack_ffffffffffffee68,
             (offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              )in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_938,"reporter to use - defaults to console",&local_939);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_960,"r",&local_961);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_988,"reporter",&local_989);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9b0,"name",&local_9b1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::argName
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_9b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
  std::__cxx11::string::~string(local_988);
  std::allocator<char>::~allocator((allocator<char> *)&local_989);
  std::__cxx11::string::~string(local_960);
  std::allocator<char>::~allocator((allocator<char> *)&local_961);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator((allocator<char> *)&local_939);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(in_stack_ffffffffffffef30);
  Clara::CommandLine<Catch::ConfigData>::bind<std::__cxx11::string_Catch::ConfigData::*>
            (in_stack_ffffffffffffee68,
             (offset_in_ConfigData_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              )in_stack_ffffffffffffee60);
  this_01 = (ArgBinder *)local_a69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_a69 + 1),"suite name",(allocator *)this_01);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a90,"n",&local_a91);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ab8,"name",&local_ab9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ae0,"name",&local_ae1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::argName
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_ae0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
  std::__cxx11::string::~string(local_ab8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ab9);
  std::__cxx11::string::~string(local_a90);
  std::allocator<char>::~allocator((allocator<char> *)&local_a91);
  std::__cxx11::string::~string((string *)(local_a69 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_a69);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(this_01);
  Clara::CommandLine<Catch::ConfigData>::bind<void(*)(Catch::ConfigData&)>
            (in_stack_ffffffffffffee68,(_func_void_ConfigData_ptr *)in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b98,"abort at first failure",&local_b99);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bc0,"a",&local_bc1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_be8,"abort",&local_be9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_be8);
  std::allocator<char>::~allocator((allocator<char> *)&local_be9);
  std::__cxx11::string::~string(local_bc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bc1);
  std::__cxx11::string::~string(local_b98);
  std::allocator<char>::~allocator((allocator<char> *)&local_b99);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(this_01);
  Clara::CommandLine<Catch::ConfigData>::bind<void(*)(Catch::ConfigData&,int)>
            (in_stack_ffffffffffffee68,(_func_void_ConfigData_ptr_int *)in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca0,"abort after x failures",&local_ca1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc8,"x",&local_cc9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cf0,"abortx",&local_cf1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d18,"number of failures",&local_d19);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::argName
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string(local_d18);
  std::allocator<char>::~allocator((allocator<char> *)&local_d19);
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cf1);
  std::__cxx11::string::~string(local_cc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc9);
  std::__cxx11::string::~string(local_ca0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(this_01);
  Clara::CommandLine<Catch::ConfigData>::
  bind<void(*)(Catch::ConfigData&,std::__cxx11::string_const&)>
            (in_stack_ffffffffffffee68,in_stack_ffffffffffffee60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd0,"enable warnings",&local_dd1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df8,"w",&local_df9);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::shortOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e20,"warn",&local_e21);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::longOpt
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  this_00 = (CommandLine<Catch::ConfigData> *)local_e49;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e49 + 1),"warning name",(allocator *)this_00);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::argName
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string((string *)(local_e49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e49);
  std::__cxx11::string::~string(local_e20);
  std::allocator<char>::~allocator((allocator<char> *)&local_e21);
  std::__cxx11::string::~string(local_df8);
  std::allocator<char>::~allocator((allocator<char> *)&local_df9);
  std::__cxx11::string::~string(local_dd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(this_01);
  Clara::CommandLine<Catch::ConfigData>::
  bind<void(*)(Catch::ConfigData&,std::__cxx11::string_const&)>(this_00,in_stack_ffffffffffffee60);
  paVar1 = &local_f01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f00,"which test or tests to use",paVar1);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::describe
            (in_stack_ffffffffffffee50,in_stack_ffffffffffffee48);
  this = (ArgBinder *)local_f29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_f29 + 1),"test name, pattern or tags",(allocator *)this);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::argName(this,in_stack_ffffffffffffee48);
  std::__cxx11::string::~string((string *)(local_f29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_f29);
  std::__cxx11::string::~string(local_f00);
  std::allocator<char>::~allocator((allocator<char> *)&local_f01);
  Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(this_01);
  return in_RDI;
}

Assistant:

inline Clara::CommandLine<ConfigData> makeCommandLineParser() {

        Clara::CommandLine<ConfigData> cli;

        cli.bindProcessName( &ConfigData::processName );

        cli.bind( &ConfigData::showHelp )
            .describe( "display usage information" )
            .shortOpt( "?")
            .shortOpt( "h")
            .longOpt( "help" );

        cli.bind( &ConfigData::listTests )
            .describe( "list all (or matching) test cases" )
            .shortOpt( "l")
            .longOpt( "list-tests" );

        cli.bind( &ConfigData::listTags )
            .describe( "list all (or matching) tags" )
            .shortOpt( "t")
            .longOpt( "list-tags" );

        cli.bind( &ConfigData::listReporters )
            .describe( "list all reporters" )
            .longOpt( "list-reporters" );

        cli.bind( &ConfigData::showSuccessfulTests )
            .describe( "include successful tests in output" )
            .shortOpt( "s")
            .longOpt( "success" );

        cli.bind( &ConfigData::shouldDebugBreak )
            .describe( "break into debugger on failure" )
            .shortOpt( "b")
            .longOpt( "break" );

        cli.bind( &ConfigData::noThrow )
            .describe( "skip exception tests" )
            .shortOpt( "e")
            .longOpt( "nothrow" );

        cli.bind( &ConfigData::outputFilename )
            .describe( "output filename" )
            .shortOpt( "o")
            .longOpt( "out" )
            .argName( "filename" );

        cli.bind( &ConfigData::reporterName )
            .describe( "reporter to use - defaults to console" )
            .shortOpt( "r")
            .longOpt( "reporter" )
//            .argName( "name[:filename]" );
            .argName( "name" );

        cli.bind( &ConfigData::name )
            .describe( "suite name" )
            .shortOpt( "n")
            .longOpt( "name" )
            .argName( "name" );

        cli.bind( &abortAfterFirst )
            .describe( "abort at first failure" )
            .shortOpt( "a")
            .longOpt( "abort" );

        cli.bind( &abortAfterX )
            .describe( "abort after x failures" )
            .shortOpt( "x")
            .longOpt( "abortx" )
            .argName( "number of failures" );

        cli.bind( &addWarning )
            .describe( "enable warnings" )
            .shortOpt( "w")
            .longOpt( "warn" )
            .argName( "warning name" );

//        cli.bind( &setVerbosity )
//            .describe( "level of verbosity (0=no output)" )
//            .shortOpt( "v")
//            .longOpt( "verbosity" )
//            .argName( "level" );

        cli.bind( &addTestOrTags )
            .describe( "which test or tests to use" )
            .argName( "test name, pattern or tags" );

        return cli;
    }